

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.cpp
# Opt level: O3

void __thiscall
VBitmap::Impl::reset
          (Impl *this,uint8_t *data,size_t width,size_t height,size_t bytesPerLine,Format format)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  uint8_t uVar2;
  
  this->mRoData = data;
  this->mWidth = (uint32_t)width;
  this->mHeight = (uint32_t)height;
  this->mStride = (uint32_t)bytesPerLine;
  this->mFormat = format;
  uVar2 = '\x01';
  if (format < 4) {
    uVar2 = (uint8_t)(0x20200801 >> (format * '\b' & 0x1f));
  }
  this->mDepth = uVar2;
  _Var1._M_head_impl =
       (this->mOwnData)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->mOwnData)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  if (_Var1._M_head_impl == (uchar *)0x0) {
    return;
  }
  operator_delete__(_Var1._M_head_impl);
  return;
}

Assistant:

void VBitmap::Impl::reset(uint8_t *data, size_t width, size_t height,
                          size_t bytesPerLine, VBitmap::Format format)
{
    mRoData = data;
    mWidth = uint32_t(width);
    mHeight = uint32_t(height);
    mStride = uint32_t(bytesPerLine);
    mFormat = format;
    mDepth = depth(format);
    mOwnData = nullptr;
}